

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O3

ArguDesc *
cxxopts::values::parser_tool::ParseArgument
          (ArguDesc *__return_storage_ptr__,char *arg,bool *matched)

{
  char **ppcVar1;
  char *pcVar2;
  char *pcVar3;
  size_t sVar4;
  long lVar5;
  ulong uVar6;
  pointer psVar7;
  pointer psVar8;
  undefined1 auStack_68 [8];
  match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_> result;
  char local_38;
  undefined7 uStack_37;
  
  result.
  super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  result.
  super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auStack_68 = (undefined1  [8])0x0;
  result.
  super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  sVar4 = strlen(arg);
  std::__detail::
  __regex_algo_impl<char_const*,std::allocator<std::__cxx11::sub_match<char_const*>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
            (arg,arg + sVar4,
             (match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_> *
             )auStack_68,
             (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
             (anonymous_namespace)::option_matcher_abi_cxx11_,0);
  uVar6 = ((long)result.
                 super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                 .
                 super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_start - (long)auStack_68 >> 3) *
          -0x5555555555555555;
  *matched = 3 < uVar6;
  (__return_storage_ptr__->arg_name)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->arg_name).field_2;
  (__return_storage_ptr__->arg_name)._M_string_length = 0;
  (__return_storage_ptr__->arg_name).field_2._M_local_buf[0] = '\0';
  __return_storage_ptr__->grouping = false;
  __return_storage_ptr__->set_value = false;
  (__return_storage_ptr__->value)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->value).field_2;
  (__return_storage_ptr__->value)._M_string_length = 0;
  (__return_storage_ptr__->value).field_2._M_local_buf[0] = '\0';
  if (3 < uVar6) {
    psVar7 = (pointer)((long)auStack_68 +
                      ((long)result.
                             super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                             .
                             super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                             ._M_impl.super__Vector_impl_data._M_start - (long)auStack_68) + -0x48);
    psVar8 = (pointer)((long)auStack_68 + 0x18);
    if (0xfffffffffffffffd < uVar6 - 5) {
      psVar8 = psVar7;
    }
    if (auStack_68 ==
        (undefined1  [8])
        result.
        super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
        .
        super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      psVar8 = psVar7;
    }
    result._M_begin = &local_38;
    if (psVar8->matched == true) {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&result._M_begin,(psVar8->super_pair<const_char_*,_const_char_*>).first,
                 (psVar8->super_pair<const_char_*,_const_char_*>).second);
    }
    else {
      local_38 = '\0';
    }
    ppcVar1 = &result._M_begin;
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)ppcVar1);
    if (result._M_begin != &local_38) {
      operator_delete(result._M_begin,CONCAT71(uStack_37,local_38) + 1);
    }
    lVar5 = (long)result.
                  super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                  .
                  super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                  ._M_impl.super__Vector_impl_data._M_start - (long)auStack_68;
    if ((lVar5 == 0) || (0xfffffffffffffffc < (lVar5 >> 3) * -0x5555555555555555 - 6U)) {
      psVar7 = (pointer)((long)auStack_68 + lVar5 + -0x48);
    }
    else {
      psVar7 = (pointer)((long)auStack_68 + 0x30);
    }
    pcVar2 = (psVar7->super_pair<const_char_*,_const_char_*>).second;
    pcVar3 = (psVar7->super_pair<const_char_*,_const_char_*>).first;
    __return_storage_ptr__->set_value =
         (bool)((pcVar2 != pcVar3 && -1 < (long)pcVar2 - (long)pcVar3) & psVar7->matched);
    if ((auStack_68 ==
         (undefined1  [8])
         result.
         super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
         .
         super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
         ._M_impl.super__Vector_impl_data._M_start) ||
       (0xfffffffffffffffb < (lVar5 >> 3) * -0x5555555555555555 - 7U)) {
      psVar7 = (pointer)((long)auStack_68 + lVar5 + -0x48);
    }
    else {
      psVar7 = (pointer)((long)auStack_68 + 0x48);
    }
    if (psVar7->matched == true) {
      result._M_begin = &local_38;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&result._M_begin,(psVar7->super_pair<const_char_*,_const_char_*>).first,
                 (psVar7->super_pair<const_char_*,_const_char_*>).second);
    }
    else {
      local_38 = '\0';
      result._M_begin = &local_38;
    }
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->value,(string *)ppcVar1);
    if (result._M_begin != &local_38) {
      operator_delete(result._M_begin,CONCAT71(uStack_37,local_38) + 1);
    }
    lVar5 = (long)result.
                  super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                  .
                  super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                  ._M_impl.super__Vector_impl_data._M_start - (long)auStack_68;
    if ((lVar5 == 0) || (0xfffffffffffffffa < (lVar5 >> 3) * -0x5555555555555555 - 8U)) {
      psVar7 = (pointer)((long)auStack_68 + lVar5 + -0x48);
    }
    else {
      psVar7 = (pointer)((long)auStack_68 + 0x60);
    }
    if ((psVar7->matched == true) &&
       (pcVar2 = (psVar7->super_pair<const_char_*,_const_char_*>).second,
       pcVar3 = (psVar7->super_pair<const_char_*,_const_char_*>).first,
       pcVar2 != pcVar3 && -1 < (long)pcVar2 - (long)pcVar3)) {
      __return_storage_ptr__->grouping = true;
      if ((auStack_68 ==
           (undefined1  [8])
           result.
           super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
           .
           super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
           ._M_impl.super__Vector_impl_data._M_start) ||
         (0xfffffffffffffffa < (lVar5 >> 3) * -0x5555555555555555 - 8U)) {
        psVar7 = (pointer)((long)auStack_68 + lVar5 + -0x48);
      }
      else {
        psVar7 = (pointer)((long)auStack_68 + 0x60);
      }
      if (psVar7->matched == true) {
        result._M_begin = &local_38;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&result._M_begin,(psVar7->super_pair<const_char_*,_const_char_*>).first
                   ,(psVar7->super_pair<const_char_*,_const_char_*>).second);
      }
      else {
        local_38 = '\0';
        result._M_begin = &local_38;
      }
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)ppcVar1);
      if (result._M_begin != &local_38) {
        operator_delete(result._M_begin,CONCAT71(uStack_37,local_38) + 1);
      }
    }
  }
  if (auStack_68 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_68,
                    (long)result.
                          super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                          .
                          super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)auStack_68);
  }
  return __return_storage_ptr__;
}

Assistant:

inline ArguDesc ParseArgument(const char *arg, bool &matched)
      {
        std::match_results<const char*> result;
        std::regex_match(arg, result, option_matcher);
        matched = !result.empty();

        ArguDesc argu_desc;
        if (matched) {
          argu_desc.arg_name = result[1].str();
          argu_desc.set_value = result[2].length() > 0;
          argu_desc.value = result[3].str();
          if (result[4].length() > 0)
          {
            argu_desc.grouping = true;
            argu_desc.arg_name = result[4].str();
          }
        }

        return argu_desc;
      }